

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_semacheck2.c
# Opt level: O2

void visit_label_stmt(gvisitor_t *self,gnode_label_stmt_t *node)

{
  gtoken_t gVar1;
  long lVar2;
  
  gVar1 = (node->base).token.type;
  lVar2 = *(long *)((long)self->data + 8);
  if ((lVar2 == 0) || (*(short *)(*(long *)((long)self->data + 0x18) + -2 + lVar2 * 2) != 0xf)) {
    if (gVar1 != TOK_KEY_CASE) {
      if (gVar1 != TOK_KEY_DEFAULT) {
        return;
      }
      report_error(self,GRAVITY_ERROR_SEMANTIC,&node->base,
                   "\'default\' statement not in switch statement.");
      goto LAB_0011c4c9;
    }
    report_error(self,GRAVITY_ERROR_SEMANTIC,&node->base,
                 "\'case\' statement not in switch statement.");
  }
  else {
    if (gVar1 == TOK_KEY_DEFAULT) goto LAB_0011c4c9;
    if (gVar1 != TOK_KEY_CASE) {
      return;
    }
  }
  gvisit(self,node->expr);
LAB_0011c4c9:
  gvisit(self,node->stmt);
  return;
}

Assistant:

static void visit_label_stmt (gvisitor_t *self, gnode_label_stmt_t *node) {
    DEBUG_SEMA2("visit_label_stmt");

    gtoken_t type = NODE_TOKEN_TYPE(node);
    if (!TOP_STATEMENT_ISA_SWITCH()) {
        if (type == TOK_KEY_DEFAULT) REPORT_ERROR(node, "'default' statement not in switch statement.");
        if (type == TOK_KEY_CASE) REPORT_ERROR(node, "'case' statement not in switch statement.");
    }

    if (type == TOK_KEY_DEFAULT) {visit(node->stmt);}
    else if (type == TOK_KEY_CASE) {visit(node->expr); visit(node->stmt);}
}